

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

match_t * clipp::detail::prefix_match<clipp::detail::select_flags>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_flags *select)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  child_t<clipp::parameter,_clipp::group> *this;
  pointer pcVar11;
  context_list *pcVar12;
  pointer pcVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  subrange sVar18;
  arg_string local_1a0;
  arg_string local_180;
  undefined1 local_160 [48];
  pointer pcStack_130;
  pointer local_120;
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  local_118;
  undefined4 local_c8;
  undefined1 local_c0 [48];
  pointer pcStack_90;
  pointer local_80;
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  local_78;
  undefined4 local_28;
  
  pcVar13 = (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((pos->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar13) {
    do {
      this = pcVar13[-1].cur._M_current;
      if ((this->type_ == param) &&
         ((this->m_).param.flags_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_).param.flags_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        sVar18 = parameter::match((parameter *)this,arg);
        if (sVar18.at_ == 0) {
          if (sVar18.length_ == arg->_M_string_length) {
            pcVar11 = (arg->_M_dataplus)._M_p;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,pcVar11,pcVar11 + sVar18.length_);
            pcVar12 = &(pos->pos_).stack_;
            auVar1._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar1._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            pcVar12 = &(pos->lastMatch_).stack_;
            auVar2._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar2._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            auVar14 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (pos->pos_).stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            auVar15 = vpbroadcastq_avx512f(auVar7);
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auVar14 = vpermi2q_avx512f(auVar14,ZEXT2464(CONCAT816(auVar15._16_8_,auVar1)),
                                       ZEXT1664(auVar2));
            auVar8._8_8_ = 0;
            auVar8._0_8_ = (pos->lastMatch_).stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            auVar15 = vpbroadcastq_avx512f(auVar8);
            auVar16._0_40_ = auVar14._0_40_;
            auVar16._40_8_ = auVar15._40_8_;
            auVar16._48_8_ = auVar14._48_8_;
            auVar16._56_8_ = auVar14._56_8_;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pcVar12 = &(pos->lastMatch_).stack_;
            auVar3._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar3._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            auVar14 = vinserti32x4_avx512f(auVar16,auVar3,3);
            _local_c0 = vmovdqu64_avx512f(auVar14);
            local_80 = (pos->posAfterLastMatch_).stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::
            _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
            ::_Deque_base(&local_78,
                          (_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                           *)&pos->scopes_);
            local_28._0_1_ = pos->curMatched_;
            local_28._1_1_ = pos->ignoreBlocks_;
            local_28._2_1_ = pos->repeatGroupStarted_;
            local_28._3_1_ = pos->repeatGroupContinues_;
            match_t::match_t(__return_storage_ptr__,&local_1a0,(scoped_dfs_traverser *)local_c0);
            std::
            _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
            ::~_Deque_base(&local_78);
            if (pcStack_90 != (pointer)0x0) {
              operator_delete(pcStack_90);
            }
            if ((pointer)local_c0._24_8_ != (pointer)0x0) {
              operator_delete((void *)local_c0._24_8_);
            }
            if ((pointer)local_c0._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_c0._0_8_);
            }
            local_180._M_dataplus._M_p = local_1a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) {
              return __return_storage_ptr__;
            }
          }
          else {
            std::__cxx11::string::substr((ulong)&local_180,(ulong)arg);
            pcVar12 = &(pos->pos_).stack_;
            auVar4._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar4._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            pcVar12 = &(pos->lastMatch_).stack_;
            auVar5._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar5._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            auVar14 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = (pos->pos_).stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            auVar15 = vpbroadcastq_avx512f(auVar9);
            (pos->pos_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auVar14 = vpermi2q_avx512f(auVar14,ZEXT2464(CONCAT816(auVar15._16_8_,auVar4)),
                                       ZEXT1664(auVar5));
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 (pos->lastMatch_).stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            auVar15 = vpbroadcastq_avx512f(auVar10);
            auVar17._0_40_ = auVar14._0_40_;
            auVar17._40_8_ = auVar15._40_8_;
            auVar17._48_8_ = auVar14._48_8_;
            auVar17._56_8_ = auVar14._56_8_;
            (pos->lastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pcVar12 = &(pos->lastMatch_).stack_;
            auVar6._0_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            auVar6._8_8_ = (pcVar12->
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            auVar14 = vinserti32x4_avx512f(auVar17,auVar6,3);
            _local_160 = vmovdqu64_avx512f(auVar14);
            local_120 = (pos->posAfterLastMatch_).stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pos->posAfterLastMatch_).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::
            _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
            ::_Deque_base(&local_118,
                          (_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                           *)&pos->scopes_);
            local_c8._0_1_ = pos->curMatched_;
            local_c8._1_1_ = pos->ignoreBlocks_;
            local_c8._2_1_ = pos->repeatGroupStarted_;
            local_c8._3_1_ = pos->repeatGroupContinues_;
            match_t::match_t(__return_storage_ptr__,&local_180,(scoped_dfs_traverser *)local_160);
            std::
            _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
            ::~_Deque_base(&local_118);
            if (pcStack_130 != (pointer)0x0) {
              operator_delete(pcStack_130);
            }
            if ((pointer)local_160._24_8_ != (pointer)0x0) {
              operator_delete((void *)local_160._24_8_);
            }
            if ((pointer)local_160._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_160._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p == &local_180.field_2) {
              return __return_storage_ptr__;
            }
          }
          operator_delete(local_180._M_dataplus._M_p);
          return __return_storage_ptr__;
        }
      }
      scoped_dfs_traverser::operator++(pos);
      pcVar13 = (pos->pos_).stack_.
                super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((pos->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start != pcVar13);
  }
  *(_Elt_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (__return_storage_ptr__->pos_).scopes_.c.
  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(__return_storage_ptr__->pos_).scopes_.c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (__return_storage_ptr__->pos_).curMatched_ = false;
  (__return_storage_ptr__->pos_).ignoreBlocks_ = false;
  (__return_storage_ptr__->pos_).repeatGroupStarted_ = false;
  (__return_storage_ptr__->pos_).repeatGroupContinues_ = false;
  *(undefined4 *)&(__return_storage_ptr__->pos_).field_0x9c = 0;
  (__return_storage_ptr__->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pos_).scopes_.c.
  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->pos_).scopes_.c.
  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->pos_).scopes_.c.
  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->str_)._M_string_length = 0;
  (__return_storage_ptr__->str_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->str_).field_2 + 8) = 0;
  (__return_storage_ptr__->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match_t::match_t(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

match_t
prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
             const ParamSelector& select)
{
    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                const auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else {
                        return match_t{arg.substr(match.at(), match.length()),
                                       std::move(pos)};
                    }
                }
            }
        }
        ++pos;
    }
    return match_t{};
}